

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-decimal128.c
# Opt level: O1

void bson_decimal128_to_string(bson_decimal128_t *dec,char *str)

{
  int *piVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  int *__s;
  uint uVar7;
  uint uVar8;
  long lVar9;
  char *__s_00;
  undefined1 *puVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  bool bVar14;
  uint32_t significand [36];
  undefined8 local_d8;
  undefined8 local_d0;
  int local_c8;
  int local_c4 [34];
  undefined1 local_3c [12];
  
  __s = &local_c8;
  memset(__s,0,0x90);
  pcVar13 = str;
  if ((long)dec->high < 0) {
    pcVar13 = str + 1;
    *str = '-';
  }
  uVar6 = dec->low;
  uVar12 = dec->high;
  uVar11 = (uint)(uVar12 >> 0x20);
  if ((~uVar11 & 0x60000000) == 0) {
    uVar7 = uVar11 >> 0x1a & 0x1f;
    if (uVar7 == 0x1f) {
      builtin_strncpy(str,"NaN",4);
      return;
    }
    if (uVar7 == 0x1e) {
      builtin_strncpy(pcVar13,"Infinity",9);
      return;
    }
    uVar7 = uVar11 >> 0xf;
    uVar8 = uVar11 >> 0xe & 1 | 8;
  }
  else {
    uVar8 = uVar11 >> 0xe & 7;
    uVar7 = uVar11 >> 0x11;
  }
  uVar7 = uVar7 & 0x3fff;
  uVar11 = uVar8 << 0xe | uVar11 & 0x3fff;
  if ((uVar8 < 8) &&
     ((int)uVar6 != 0 || (((int)(uVar6 >> 0x20) != 0 || (int)uVar12 != 0) || uVar11 != 0))) {
    lVar9 = 3;
    puVar10 = local_3c;
    local_d0 = uVar6 << 0x20 | uVar6 >> 0x20;
    local_d8 = (ulong)uVar11;
    do {
      iVar5 = (int)local_d8;
      local_d8 = local_d8 & 0xffffffff | uVar12 << 0x20;
      uVar6 = local_d0;
      if ((((iVar5 == 0) && (local_d8._4_4_ = (int)uVar12, local_d8._4_4_ == 0)) &&
          ((int)local_d0 == 0)) && (local_d0._4_4_ = (int)(local_d0 >> 0x20), local_d0._4_4_ == 0))
      {
        uVar12 = 0;
        local_d0 = uVar6;
      }
      else {
        lVar3 = 0;
        uVar12 = 0;
        local_d0 = uVar6;
        do {
          uVar12 = uVar12 << 0x20 | (ulong)*(uint *)((long)&local_d8 + lVar3 * 4);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar12;
          uVar6 = SUB168(auVar2 * ZEXT816(0x112e0be826d694b3),8) >> 0x1a;
          *(int *)((long)&local_d8 + lVar3 * 4) = (int)uVar6;
          uVar12 = uVar12 + uVar6 * -1000000000;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
      }
      if ((int)uVar12 != 0) {
        lVar3 = 0;
        do {
          iVar5 = (int)uVar12;
          uVar6 = uVar12 & 0xffffffff;
          uVar12 = uVar6 / 10;
          *(int *)(puVar10 + lVar3 * 4) = iVar5 + (int)(uVar6 / 10) * -10;
          lVar3 = lVar3 + -1;
        } while (lVar3 != -9);
      }
      uVar12 = local_d8 >> 0x20;
      puVar10 = puVar10 + -0x24;
      bVar14 = lVar9 != 0;
      lVar9 = lVar9 + -1;
    } while (bVar14);
    uVar11 = 0x24;
    if (local_c8 == 0) {
      uVar11 = 0x24;
      piVar4 = &local_c8;
      do {
        uVar11 = uVar11 - 1;
        __s = piVar4 + 1;
        piVar1 = piVar4 + 1;
        piVar4 = __s;
      } while (*piVar1 == 0);
    }
  }
  else {
    local_c8 = 0;
    uVar11 = 1;
  }
  if ((0x1820 < uVar7) || ((int)(uVar11 + (uVar7 - 0x1820) + -1) < -6)) {
    *pcVar13 = (char)*__s + '0';
    if (uVar11 - 1 == 0) {
      pcVar13 = pcVar13 + 1;
    }
    else {
      pcVar13[1] = '.';
      pcVar13 = pcVar13 + 2;
      if ((long)pcVar13 - (long)str < 0x24) {
        uVar6 = 0;
        do {
          pcVar13[uVar6] = (char)__s[uVar6 + 1] + '0';
          uVar12 = uVar6 + 1;
          if (uVar11 - 1 <= uVar12) break;
          lVar9 = uVar6 + ((long)pcVar13 - (long)str) + 1;
          uVar6 = uVar12;
        } while (lVar9 < 0x24);
        pcVar13 = pcVar13 + uVar12;
      }
    }
    *pcVar13 = 'E';
    bson_snprintf(pcVar13 + 1,6,"%+d");
    return;
  }
  if (uVar7 < 0x1820) {
    uVar8 = (uVar7 - 0x1820) + uVar11;
    if ((int)uVar8 < 1) {
      *pcVar13 = '0';
      pcVar13 = pcVar13 + 1;
    }
    else if ((long)pcVar13 - (long)str < 0x2b) {
      lVar9 = 0;
      uVar6 = 0;
      do {
        pcVar13[uVar6] = (char)__s[uVar6] + '0';
        uVar12 = uVar6 + 1;
        lVar9 = lVar9 + 4;
        if (uVar8 <= uVar12) break;
        lVar3 = uVar6 + ((long)pcVar13 - (long)str) + 1;
        uVar6 = uVar12;
      } while (lVar3 < 0x2b);
      pcVar13 = pcVar13 + uVar12;
      __s = (int *)((long)__s + lVar9);
    }
    *pcVar13 = '.';
    __s_00 = pcVar13 + 1;
    if ((int)uVar8 < 0) {
      uVar6 = (ulong)(0x181f - (uVar7 + uVar11));
      memset(__s_00,0x30,uVar6 + 1);
      __s_00 = pcVar13 + uVar6 + 2;
      uVar8 = 0;
    }
    if ((uVar11 - uVar8 != 0) && ((long)__s_00 - (long)str < 0x2b)) {
      uVar6 = 0;
      do {
        __s_00[uVar6] = (char)__s[uVar6] + '0';
        uVar12 = uVar6 + 1;
        if (uVar11 - uVar8 <= uVar12) break;
        lVar9 = uVar6 + ((long)__s_00 - (long)str) + 1;
        uVar6 = uVar12;
      } while (lVar9 < 0x2b);
      __s_00 = __s_00 + uVar12;
    }
    *__s_00 = '\0';
  }
  else {
    if ((long)pcVar13 - (long)str < 0x24 && uVar11 != 0) {
      uVar6 = 0;
      do {
        pcVar13[uVar6] = (char)__s[uVar6] + '0';
        uVar12 = uVar6 + 1;
        if (uVar11 <= uVar12) break;
        lVar9 = uVar6 + ((long)pcVar13 - (long)str) + 1;
        uVar6 = uVar12;
      } while (lVar9 < 0x24);
      pcVar13 = pcVar13 + uVar12;
    }
    *pcVar13 = '\0';
  }
  return;
}

Assistant:

void
bson_decimal128_to_string (const bson_decimal128_t *dec, /* IN  */
                           char *str)                    /* OUT */
{
   uint32_t COMBINATION_MASK = 0x1f;   /* Extract least significant 5 bits */
   uint32_t EXPONENT_MASK = 0x3fff;    /* Extract least significant 14 bits */
   uint32_t COMBINATION_INFINITY = 30; /* Value of combination field for Inf */
   uint32_t COMBINATION_NAN = 31;      /* Value of combination field for NaN */
   uint32_t EXPONENT_BIAS = 6176;      /* decimal128 exponent bias */

   char *str_out = str;      /* output pointer in string */
   char significand_str[35]; /* decoded significand digits */


   /* Note: bits in this routine are referred to starting at 0, */
   /* from the sign bit, towards the coefficient. */
   uint32_t high;                   /* bits 0 - 31 */
   uint32_t midh;                   /* bits 32 - 63 */
   uint32_t midl;                   /* bits 64 - 95 */
   uint32_t low;                    /* bits 96 - 127 */
   uint32_t combination;            /* bits 1 - 5 */
   uint32_t biased_exponent;        /* decoded biased exponent (14 bits) */
   uint32_t significand_digits = 0; /* the number of significand digits */
   uint32_t significand[36] = {0};  /* the base-10 digits in the significand */
   uint32_t *significand_read = significand; /* read pointer into significand */
   int32_t exponent;                         /* unbiased exponent */
   int32_t scientific_exponent; /* the exponent if scientific notation is
                                 * used */
   bool is_zero = false;        /* true if the number is zero */

   uint8_t significand_msb; /* the most signifcant significand bits (50-46) */
   _bson_uint128_t
      significand128; /* temporary storage for significand decoding */
   size_t i;          /* indexing variables */
   int j, k;

   memset (significand_str, 0, sizeof (significand_str));

   if ((int64_t) dec->high < 0) { /* negative */
      *(str_out++) = '-';
   }

   low = (uint32_t) dec->low, midl = (uint32_t) (dec->low >> 32),
   midh = (uint32_t) dec->high, high = (uint32_t) (dec->high >> 32);

   /* Decode combination field and exponent */
   combination = (high >> 26) & COMBINATION_MASK;

   if (BSON_UNLIKELY ((combination >> 3) == 3)) {
      /* Check for 'special' values */
      if (combination == COMBINATION_INFINITY) { /* Infinity */
         strcpy (str_out, BSON_DECIMAL128_INF);
         return;
      } else if (combination == COMBINATION_NAN) { /* NaN */
         /* str, not str_out, to erase the sign */
         strcpy (str, BSON_DECIMAL128_NAN);
         /* we don't care about the NaN payload. */
         return;
      } else {
         biased_exponent = (high >> 15) & EXPONENT_MASK;
         significand_msb = 0x8 + ((high >> 14) & 0x1);
      }
   } else {
      significand_msb = (high >> 14) & 0x7;
      biased_exponent = (high >> 17) & EXPONENT_MASK;
   }

   exponent = biased_exponent - EXPONENT_BIAS;
   /* Create string of significand digits */

   /* Convert the 114-bit binary number represented by */
   /* (high, midh, midl, low) to at most 34 decimal */
   /* digits through modulo and division. */
   significand128.parts[0] = (high & 0x3fff) + ((significand_msb & 0xf) << 14);
   significand128.parts[1] = midh;
   significand128.parts[2] = midl;
   significand128.parts[3] = low;

   if (significand128.parts[0] == 0 && significand128.parts[1] == 0 &&
       significand128.parts[2] == 0 && significand128.parts[3] == 0) {
      is_zero = true;
   } else if (significand128.parts[0] >= (1 << 17)) {
      /* The significand is non-canonical or zero.
       * In order to preserve compatability with the densely packed decimal
       * format, the maximum value for the significand of decimal128 is
       * 1e34 - 1.  If the value is greater than 1e34 - 1, the IEEE 754
       * standard dictates that the significand is interpreted as zero.
       */
      is_zero = true;
   } else {
      for (k = 3; k >= 0; k--) {
         uint32_t least_digits = 0;
         _bson_uint128_divide1B (
            significand128, &significand128, &least_digits);

         /* We now have the 9 least significant digits (in base 2). */
         /* Convert and output to string. */
         if (!least_digits) {
            continue;
         }

         for (j = 8; j >= 0; j--) {
            significand[k * 9 + j] = least_digits % 10;
            least_digits /= 10;
         }
      }
   }

   /* Output format options: */
   /* Scientific - [-]d.dddE(+/-)dd or [-]dE(+/-)dd */
   /* Regular    - ddd.ddd */

   if (is_zero) {
      significand_digits = 1;
      *significand_read = 0;
   } else {
      significand_digits = 36;
      while (!(*significand_read)) {
         significand_digits--;
         significand_read++;
      }
   }

   scientific_exponent = significand_digits - 1 + exponent;

   /* The scientific exponent checks are dictated by the string conversion
    * specification and are somewhat arbitrary cutoffs.
    *
    * We must check exponent > 0, because if this is the case, the number
    * has trailing zeros.  However, we *cannot* output these trailing zeros,
    * because doing so would change the precision of the value, and would
    * change stored data if the string converted number is round tripped.
    */
   if (scientific_exponent < -6 || exponent > 0) {
      /* Scientific format */
      *(str_out++) = *(significand_read++) + '0';
      significand_digits--;

      if (significand_digits) {
         *(str_out++) = '.';
      }

      for (i = 0; i < significand_digits && (str_out - str) < 36; i++) {
         *(str_out++) = *(significand_read++) + '0';
      }
      /* Exponent */
      *(str_out++) = 'E';
      bson_snprintf (str_out, 6, "%+d", scientific_exponent);
   } else {
      /* Regular format with no decimal place */
      if (exponent >= 0) {
         for (i = 0; i < significand_digits && (str_out - str) < 36; i++) {
            *(str_out++) = *(significand_read++) + '0';
         }
         *str_out = '\0';
      } else {
         int32_t radix_position = significand_digits + exponent;

         if (radix_position > 0) { /* non-zero digits before radix */
            for (i = 0;
                 i < radix_position && (str_out - str) < BSON_DECIMAL128_STRING;
                 i++) {
               *(str_out++) = *(significand_read++) + '0';
            }
         } else { /* leading zero before radix point */
            *(str_out++) = '0';
         }

         *(str_out++) = '.';
         while (radix_position++ < 0) { /* add leading zeros after radix */
            *(str_out++) = '0';
         }

         for (i = 0;
              (i < significand_digits - BSON_MAX (radix_position - 1, 0)) &&
              (str_out - str) < BSON_DECIMAL128_STRING;
              i++) {
            *(str_out++) = *(significand_read++) + '0';
         }
         *str_out = '\0';
      }
   }
}